

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O2

iterator * __thiscall pybind11::detail::values_and_holders::iterator::operator++(iterator *this)

{
  size_t sVar1;
  type_info *ptVar2;
  pointer pptVar3;
  type_vec *ptVar4;
  
  if ((this->inst->field_0x30 & 2) == 0) {
    ptVar4 = this->types;
    sVar1 = (this->curr).index;
    pptVar3 = (ptVar4->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    (this->curr).vh = (this->curr).vh + pptVar3[sVar1]->holder_size_in_ptrs + 1;
  }
  else {
    ptVar4 = this->types;
    sVar1 = (this->curr).index;
    pptVar3 = (ptVar4->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
  }
  (this->curr).index = sVar1 + 1;
  if (sVar1 + 1 <
      (ulong)((long)(ptVar4->
                    super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pptVar3 >> 3)) {
    ptVar2 = pptVar3[sVar1 + 1];
  }
  else {
    ptVar2 = (type_info *)0x0;
  }
  (this->curr).type = ptVar2;
  return this;
}

Assistant:

iterator &operator++() {
            if (!inst->simple_layout) {
                curr.vh += 1 + (*types)[curr.index]->holder_size_in_ptrs;
            }
            ++curr.index;
            curr.type = curr.index < types->size() ? (*types)[curr.index] : nullptr;
            return *this;
        }